

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

reference * __thiscall
mjs::interpreter::impl::scope::lookup(reference *__return_storage_ptr__,scope *this,string *id)

{
  bool bVar1;
  object *this_00;
  uint *puVar2;
  scope *this_01;
  undefined1 local_30 [16];
  
  this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->activation_,this->heap_);
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)id);
  local_30._0_8_ = ZEXT48(*puVar2);
  local_30._8_8_ = puVar2 + 1;
  bVar1 = object::has_property(this_00,(wstring_view *)local_30);
  if (bVar1) {
    gc_heap::unsafe_create_from_position<mjs::object>((gc_heap *)local_30,(uint32_t)this->heap_);
    reference::reference(__return_storage_ptr__,(object_ptr *)local_30,id);
  }
  else {
    if ((this->prev_).pos_ != 0) {
      this_01 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                          (&this->prev_,this->heap_);
      lookup(__return_storage_ptr__,this_01,id);
      return __return_storage_ptr__;
    }
    local_30._0_8_ = (gc_heap *)0x0;
    local_30._8_8_ = local_30._8_8_ & 0xffffffff00000000;
    reference::reference(__return_storage_ptr__,(object_ptr *)local_30,id);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_30);
  return __return_storage_ptr__;
}

Assistant:

reference lookup(const string& id) const {
            if (activation_.dereference(heap_).has_property(id.view())) {
                return reference{activation_.track(heap_), id};
            }
            if (prev_) {
                return prev_.dereference(heap_).lookup(id);
            } else {
                return reference{nullptr, id};
            }
        }